

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O0

Error * ot::commissioner::FileLogger::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::FileLogger> *aFileLogger,string *aFilename,
                  LogLevel aLogLevel)

{
  bool bVar1;
  FileLogger *this;
  element_type *this_00;
  Error *aError;
  ErrorCode local_74;
  Error local_70;
  undefined1 local_38 [8];
  shared_ptr<ot::commissioner::FileLogger> logger;
  LogLevel aLogLevel_local;
  string *aFilename_local;
  shared_ptr<ot::commissioner::FileLogger> *aFileLogger_local;
  Error *error;
  
  logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 0;
  logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = aLogLevel;
  Error::Error(__return_storage_ptr__);
  this = (FileLogger *)operator_new(0x40);
  FileLogger(this);
  std::shared_ptr<ot::commissioner::FileLogger>::shared_ptr<ot::commissioner::FileLogger,void>
            ((shared_ptr<ot::commissioner::FileLogger> *)local_38,this);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
  Init(&local_70,this_00,aFilename,
       logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_);
  aError = Error::operator=(__return_storage_ptr__,&local_70);
  local_74 = kNone;
  bVar1 = commissioner::operator!=(aError,&local_74);
  Error::~Error(&local_70);
  if (!bVar1) {
    std::shared_ptr<ot::commissioner::FileLogger>::operator=
              (aFileLogger,(shared_ptr<ot::commissioner::FileLogger> *)local_38);
  }
  logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 1;
  std::shared_ptr<ot::commissioner::FileLogger>::~shared_ptr
            ((shared_ptr<ot::commissioner::FileLogger> *)local_38);
  if ((logger.super___shared_ptr<ot::commissioner::FileLogger,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error FileLogger::Create(std::shared_ptr<FileLogger> &aFileLogger, const std::string &aFilename, LogLevel aLogLevel)
{
    Error error;
    auto  logger = std::shared_ptr<FileLogger>(new FileLogger);

    SuccessOrExit(error = logger->Init(aFilename, aLogLevel));
    aFileLogger = logger;

exit:
    return error;
}